

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetPropertyWithAttributes
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  byte bVar2;
  code *pcVar3;
  Var value_00;
  JavascriptLibrary *this_00;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  PropertyId propertyId_00;
  PathTypeHandlerBase *pPVar7;
  SimpleTypeHandler<2UL> *pSVar8;
  ushort uVar9;
  undefined7 in_register_00000081;
  ulong uVar10;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar11;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_80;
  uint32 local_74;
  PropertyValueInfo *pPStack_70;
  uint32 indexVal;
  Var local_68;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *local_60;
  DynamicObject *local_58;
  JavascriptLibrary *local_50;
  SimpleTypeHandler<2UL> *local_48;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_40;
  SideEffects local_31;
  
  uVar10 = CONCAT71(in_register_00000081,attributes);
  local_31 = possibleSideEffects;
  pPStack_70 = info;
  local_68 = value;
  if (0 < this->propertyCount) {
    uVar9 = 0;
    do {
      if ((this->descriptors[uVar9].Id.ptr)->pid == propertyId) {
        paVar11 = &this->descriptors[uVar9].field_1;
        local_58 = instance;
        if (paVar11->Attributes != attributes) {
          local_40 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
                     CONCAT44(local_40._4_4_,(int)uVar10);
          pSVar8 = this;
          local_60 = paVar11;
          if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
            local_48 = (SimpleTypeHandler<2UL> *)(instance->super_RecyclableObject).type.ptr;
            bVar4 = DoConvertToPathType((DynamicType *)local_48);
            if (bVar4) {
              pPVar7 = ConvertToPathType(this,instance);
              iVar6 = (*(pPVar7->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                                (pPVar7,instance,(ulong)(uint)propertyId,local_68,
                                 (ulong)local_40 & 0xff,pPStack_70);
              return iVar6;
            }
            pSVar8 = ConvertToNonSharedSimpleType(this,instance);
            if ((*(Type *)((long)local_48 + 0x30) == true) &&
               ((SimpleTypeHandler<2UL> *)(instance->super_RecyclableObject).type.ptr == local_48))
            {
              AssertCount = AssertCount + 1;
              local_48 = pSVar8;
              Throw::LogAssert();
              local_50 = (JavascriptLibrary *)__tls_get_addr(&PTR_01548f08);
              *(undefined4 *)
               &(local_50->super_JavascriptLibraryBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                          ,0x3fb,
                                          "(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType)"
                                          ,
                                          "!oldType->GetIsLocked() || instance->GetDynamicType() != oldType"
                                         );
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *(undefined4 *)
               &(local_50->super_JavascriptLibraryBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
              uVar10 = (ulong)local_40 & 0xffffffff;
              pSVar8 = local_48;
              instance = local_58;
            }
            else {
              uVar10 = (ulong)local_40 & 0xffffffff;
            }
          }
          local_48 = pSVar8;
          if ((local_60->Attributes & 8) != 0) {
            ScriptContext::InvalidateProtoCaches
                      ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
            instance = local_58;
          }
          local_48->descriptors[uVar9].field_1.Attributes = (Type)uVar10;
          if ((uVar10 & 1) != 0) {
            DynamicObject::SetHasNoEnumerableProperties(instance,false);
            instance = local_58;
          }
          local_50 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
          pTVar1 = &local_50->typesWithOnlyWritablePropertyProtoChain;
          Memory::Recycler::WBSetBit((char *)&local_80);
          local_80 = pTVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_80);
          pSVar8 = local_48;
          paVar11 = local_60;
          if (((ulong)local_40 & 4) == 0) {
            local_40 = local_80;
            local_50 = (JavascriptLibrary *)
                       (local_50->super_JavascriptLibraryBase).scriptContext.ptr;
            DynamicTypeHandler::SetHasOnlyWritableDataProperties
                      (&local_48->super_DynamicTypeHandler,false);
            this_00 = local_50;
            paVar11 = local_60;
            if (((pSVar8->super_DynamicTypeHandler).flags & 0x20) != 0) {
              propertyId_00 =
                   DynamicTypeHandler::TMapKey_GetPropertyId((ScriptContext *)local_50,propertyId);
              ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_00,propertyId_00);
              PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_40);
              paVar11 = local_60;
            }
          }
        }
        value_00 = local_68;
        DynamicTypeHandler::SetSlotUnchecked(local_58,(uint)uVar9,local_68);
        if (pPStack_70 != (PropertyValueInfo *)0x0) {
          bVar2 = paVar11->Attributes;
          pPStack_70->m_instance = &local_58->super_RecyclableObject;
          pPStack_70->m_propertyIndex = uVar9;
          pPStack_70->m_attributes = bVar2;
          pPStack_70->flags = InlineCacheNoFlags;
        }
        DynamicTypeHandler::SetPropertyUpdateSideEffect
                  (&this->super_DynamicTypeHandler,local_58,propertyId,value_00,local_31);
        return 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uint)uVar9 < (uint)this->propertyCount);
  }
  BVar5 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,&local_74);
  if (BVar5 == 0) {
    BVar5 = AddProperty(this,instance,propertyId,local_68,attributes,pPStack_70,flags,local_31);
  }
  else {
    BVar5 = DynamicTypeHandler::SetItemWithAttributes
                      (&this->super_DynamicTypeHandler,instance,local_74,local_68,attributes);
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes != attributes)
            {
                SimpleTypeHandler * typeHandler = this;
                if (GetIsLocked())
                {
                    DynamicType* oldType = instance->GetDynamicType();
                    if (DoConvertToPathType(oldType))
                    {
                        return this->ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }
                    else
                    {
                        // Don't attempt to share cross-site function types
                        typeHandler = this->ConvertToNonSharedSimpleType(instance);
                    }
                    Assert(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType);
                }
                if (descriptors[index].Attributes & PropertyDeleted)
                {
                    instance->GetScriptContext()->InvalidateProtoCaches(propertyId);
                }
                typeHandler->descriptors[index].Attributes = attributes;
                if (attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, attributes, propertyId, library->GetScriptContext());
            }
            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. May create objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemWithAttributes(instance, indexVal, value, attributes);
        }

        return this->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
    }